

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int lj_cf_ffi_clib___index(lua_State *L)

{
  int iVar1;
  TValue *s_00;
  long *plVar2;
  TValue *o;
  uint *sp_00;
  CTState *in_RDI;
  CType *ct;
  void *sp;
  CTypeID sid;
  CType *s;
  GCcdata *cd;
  CTState *cts;
  TValue *tv;
  CTState *cts_1;
  CType *ct_1;
  lua_State *in_stack_fffffffffffffef0;
  TValue L_00;
  uint *local_88;
  
  s_00 = ffi_clib_index(in_stack_fffffffffffffef0);
  if ((s_00->field_2).it == 0xfffffff5) {
    plVar2 = (long *)(ulong)*(uint *)((ulong)in_RDI->top + 0x194);
    plVar2[2] = (long)in_RDI;
    o = (TValue *)(ulong)(s_00->u32).lo;
    sp_00 = (uint *)(*plVar2 + (ulong)*(ushort *)((long)&(o->field_2).it + 2) * 0x10);
    if (*sp_00 >> 0x1c == 0xc) {
      L_00 = o[1];
      for (local_88 = (uint *)(*plVar2 + (ulong)(*sp_00 & 0xffff) * 0x10); *local_88 >> 0x1c == 8;
          local_88 = (uint *)(*plVar2 + (ulong)(*local_88 & 0xffff) * 0x10)) {
      }
      iVar1 = lj_cconv_tv_ct(in_RDI,(CType *)&s_00->field_2,0,o,(uint8_t *)sp_00);
      if (iVar1 == 0) {
        return 1;
      }
      if (*(uint *)((ulong)in_RDI->top + 0x50) < *(uint *)((ulong)in_RDI->top + 0x54)) {
        return 1;
      }
      lj_gc_step((lua_State *)L_00);
      return 1;
    }
  }
  in_RDI->g[-1].top_frame_info.top_frame = (TValue *)*(anon_struct_8_2_f9ee98fb_for_u32 *)s_00;
  return 1;
}

Assistant:

LJLIB_CF(ffi_clib___index)	LJLIB_REC(clib_index 1)
{
  TValue *tv = ffi_clib_index(L);
  if (tviscdata(tv)) {
    CTState *cts = ctype_cts(L);
    GCcdata *cd = cdataV(tv);
    CType *s = ctype_get(cts, cd->ctypeid);
    if (ctype_isextern(s->info)) {
      CTypeID sid = ctype_cid(s->info);
      void *sp = *(void **)cdataptr(cd);
      CType *ct = ctype_raw(cts, sid);
      if (lj_cconv_tv_ct(cts, ct, sid, L->top-1, sp))
	lj_gc_check(L);
      return 1;
    }
  }
  copyTV(L, L->top-1, tv);
  return 1;
}